

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::B3DImporter::ReadBONE(B3DImporter *this,int id)

{
  pointer pVVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  B3DImporter *this_00;
  float fVar5;
  allocator<char> local_49;
  
LAB_003e9989:
  do {
    if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] == this->_pos) {
      return;
    }
    uVar3 = ReadInt(this);
    fVar5 = ReadFloat(this);
    if (((int)uVar3 < 0) ||
       (pVVar1 = (this->_vertices).
                 super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start, lVar2 = -4,
       (int)(((long)(this->_vertices).
                    super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x38) <= (int)uVar3
       )) {
      this_00 = (B3DImporter *)&stack0xffffffffffffffb8;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffffb8,"Bad vertex index",&local_49);
      Fail(this_00,(string *)&stack0xffffffffffffffb8);
    }
    do {
      lVar4 = lVar2;
      if (lVar4 == 0) goto LAB_003e9989;
      lVar2 = lVar4 + 1;
    } while ((*(float *)(pVVar1[(ulong)uVar3 + 1].bones + lVar4 * 4 + -0x24) != 0.0) ||
            (NAN(*(float *)(pVVar1[(ulong)uVar3 + 1].bones + lVar4 * 4 + -0x24))));
    *(char *)((long)pVVar1[uVar3].weights + lVar4) = (char)id;
    *(float *)(pVVar1[(ulong)uVar3 + 1].bones + lVar4 * 4 + -0x24) = fVar5;
  } while( true );
}

Assistant:

void B3DImporter::ReadBONE(int id) {
	while (ChunkSize()) {
		int vertex = ReadInt();
		float weight = ReadFloat();
		if (vertex < 0 || vertex >= (int)_vertices.size()) {
			Fail("Bad vertex index");
		}

		Vertex &v = _vertices[vertex];
		for (int i = 0; i < 4; ++i) {
			if (!v.weights[i]) {
				v.bones[i] = id;
				v.weights[i] = weight;
				break;
			}
		}
	}
}